

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

iterator __thiscall
fmt::v6::internal::
arg_formatter_base<fmt::v6::buffer_range<wchar_t>,_fmt::v6::internal::error_handler>::operator()
          (arg_formatter_base<fmt::v6::buffer_range<wchar_t>,_fmt::v6::internal::error_handler>
           *this,char_type *value)

{
  char cVar1;
  format_specs *specs;
  size_t in_RCX;
  
  specs = this->specs_;
  if (specs != (format_specs *)0x0) {
    cVar1 = specs->type;
    if (cVar1 != 's') {
      if (cVar1 == 'p') {
        basic_writer<fmt::v6::buffer_range<wchar_t>_>::write_pointer<unsigned_long>
                  (&this->writer_,(unsigned_long)value,specs);
        goto LAB_00151dff;
      }
      if (cVar1 != '\0') {
        error_handler::on_error((error_handler *)this,"invalid type specifier");
      }
    }
  }
  write(this,(int)value,specs,in_RCX);
LAB_00151dff:
  return (iterator)(this->writer_).out_.container;
}

Assistant:

iterator operator()(const char_type* value) {
    if (!specs_) return write(value), out();
    internal::handle_cstring_type_spec(specs_->type,
                                       cstring_spec_handler(*this, value));
    return out();
  }